

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.cpp
# Opt level: O0

utf8proc_ssize_t duckdb::utf8proc_encode_char(utf8proc_int32_t uc,utf8proc_uint8_t *dst)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  utf8proc_uint8_t *dst_local;
  utf8proc_int32_t uc_local;
  utf8proc_ssize_t local_8;
  
  if (uc < 0) {
    local_8 = 0;
  }
  else {
    bVar3 = (byte)uc;
    if (uc < 0x80) {
      *dst = bVar3;
      local_8 = 1;
    }
    else {
      bVar1 = (byte)(uc >> 6);
      if (uc < 0x800) {
        *dst = bVar1 - 0x40;
        dst[1] = (bVar3 & 0x3f) + 0x80;
        local_8 = 2;
      }
      else {
        bVar2 = (byte)(uc >> 0xc);
        if (uc < 0x10000) {
          *dst = bVar2 - 0x20;
          dst[1] = (bVar1 & 0x3f) + 0x80;
          dst[2] = (bVar3 & 0x3f) + 0x80;
          local_8 = 3;
        }
        else if (uc < 0x110000) {
          *dst = (char)(uc >> 0x12) + 0xf0;
          dst[1] = (bVar2 & 0x3f) + 0x80;
          dst[2] = (bVar1 & 0x3f) + 0x80;
          dst[3] = (bVar3 & 0x3f) + 0x80;
          local_8 = 4;
        }
        else {
          local_8 = 0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_encode_char(utf8proc_int32_t uc, utf8proc_uint8_t *dst) {
  if (uc < 0x00) {
    return 0;
  } else if (uc < 0x80) {
    dst[0] = (utf8proc_uint8_t) uc;
    return 1;
  } else if (uc < 0x800) {
    dst[0] = (utf8proc_uint8_t)(0xC0 + (uc >> 6));
    dst[1] = (utf8proc_uint8_t)(0x80 + (uc & 0x3F));
    return 2;
    // Note: we allow encoding 0xd800-0xdfff here, so as not to change
    // the API, however, these are actually invalid in UTF-8
  } else if (uc < 0x10000) {
    dst[0] = (utf8proc_uint8_t)(0xE0 + (uc >> 12));
    dst[1] = (utf8proc_uint8_t)(0x80 + ((uc >> 6) & 0x3F));
    dst[2] = (utf8proc_uint8_t)(0x80 + (uc & 0x3F));
    return 3;
  } else if (uc < 0x110000) {
    dst[0] = (utf8proc_uint8_t)(0xF0 + (uc >> 18));
    dst[1] = (utf8proc_uint8_t)(0x80 + ((uc >> 12) & 0x3F));
    dst[2] = (utf8proc_uint8_t)(0x80 + ((uc >> 6) & 0x3F));
    dst[3] = (utf8proc_uint8_t)(0x80 + (uc & 0x3F));
    return 4;
  } else return 0;
}